

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcAsymmetricIShapeProfileDef::~IfcAsymmetricIShapeProfileDef
          (IfcAsymmetricIShapeProfileDef *this,void **vtt)

{
  void **vtt_local;
  IfcAsymmetricIShapeProfileDef *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAsymmetricIShapeProfileDef,_4UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcAsymmetricIShapeProfileDef,_4UL> *)
             &(this->super_IfcIShapeProfileDef).field_0xb0,vtt + 0x10);
  IfcIShapeProfileDef::~IfcIShapeProfileDef(&this->super_IfcIShapeProfileDef,vtt + 1);
  return;
}

Assistant:

IfcAsymmetricIShapeProfileDef() : Object("IfcAsymmetricIShapeProfileDef") {}